

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

QString * __thiscall
VcprojGenerator::replaceExtraCompilerVariables
          (QString *__return_storage_ptr__,VcprojGenerator *this,QString *var,QStringList *in,
          QStringList *out,ReplaceFor forShell)

{
  QMakeProject *pQVar1;
  QList<ProString> *pQVar2;
  QString *pQVar3;
  iterator this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_1b8;
  QArrayDataPointer<char16_t> local_1a0;
  QArrayDataPointer<char16_t> local_188;
  ProKey local_170;
  QArrayDataPointer<char16_t> local_140;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_110;
  QArrayDataPointer<char16_t> local_f8;
  ProKey local_e0;
  QArrayDataPointer<char16_t> local_b0;
  QStringBuilder<QString,_QString> local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  MakefileGenerator::replaceExtraCompilerVariables
            (__return_storage_ptr__,(MakefileGenerator *)this,var,in,out,forShell);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"VCPROJ_MAKEFILE_DEFINES");
  pQVar2 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68)->
            super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if ((pQVar2->d).size == 0) {
    ProKey::ProKey(&local_e0,"PRL_EXPORT_DEFINES");
    QString::QString((QString *)&local_f8," -D");
    QString::QString((QString *)&local_110," -D");
    QString::QString((QString *)&local_128,"");
    MakefileGenerator::varGlue
              ((QString *)&local_b0,(MakefileGenerator *)this,&local_e0,(QString *)&local_f8,
               (QString *)&local_110,(QString *)&local_128);
    ProKey::ProKey(&local_170,"DEFINES");
    QString::QString((QString *)&local_188," -D");
    QString::QString((QString *)&local_1a0," -D");
    QString::QString((QString *)&QStack_1b8,"");
    MakefileGenerator::varGlue
              ((QString *)&local_140,(MakefileGenerator *)this,&local_170,(QString *)&local_188,
               (QString *)&local_1a0,(QString *)&QStack_1b8);
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_98,(QString *)&local_b0,(QString *)&local_140);
    ProString::ProString<QString,QString>(&local_68,&local_98);
    QList<ProString>::emplaceBack<ProString>(pQVar2,&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_140);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_1b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_170);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e0);
  }
  pQVar3 = (QString *)QtPrivate::lengthHelperPointer<char>("$(DEFINES)");
  this_00 = QList<ProString>::begin(pQVar2);
  ProString::toQString(&local_68.m_string,this_00.i);
  QString::replace((QLatin1String *)__return_storage_ptr__,pQVar3,0x21ddf2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"VCPROJ_MAKEFILE_INCPATH");
  pQVar2 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68)->
            super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if ((pQVar2->d).size == 0) {
    ProKey::ProKey((ProKey *)&local_68,"MSVCPROJ_INCPATH");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_98,this,&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (local_98.a.d.size != 0) {
      ProKey::ProKey((ProKey *)&local_98,"MSVCPROJ_INCPATH");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])((QArrayDataPointer<char16_t> *)&local_e0,this,&local_98);
      ProString::ProString(&local_68,(QString *)&local_e0);
      QList<ProString>::emplaceBack<ProString>(pQVar2,&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    }
  }
  pQVar3 = (QString *)QtPrivate::lengthHelperPointer<char>("$(INCPATH)");
  ProStringList::join(&local_68.m_string,(ProStringList *)pQVar2,(QChar)0x20);
  QString::replace((QLatin1String *)__return_storage_ptr__,pQVar3,0x21c3aa);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::replaceExtraCompilerVariables(
        const QString &var, const QStringList &in, const QStringList &out, ReplaceFor forShell)
{
    QString ret = MakefileGenerator::replaceExtraCompilerVariables(var, in, out, forShell);

    ProStringList &defines = project->values("VCPROJ_MAKEFILE_DEFINES");
    if(defines.isEmpty())
        defines.append(varGlue("PRL_EXPORT_DEFINES"," -D"," -D","") +
                       varGlue("DEFINES"," -D"," -D",""));
    ret.replace(QLatin1String("$(DEFINES)"), defines.first().toQString());

    ProStringList &incpath = project->values("VCPROJ_MAKEFILE_INCPATH");
    if(incpath.isEmpty() && !this->var("MSVCPROJ_INCPATH").isEmpty())
        incpath.append(this->var("MSVCPROJ_INCPATH"));
    ret.replace(QLatin1String("$(INCPATH)"), incpath.join(' '));

    return ret;
}